

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageUtil.cpp
# Opt level: O0

void deqp::egl::Image::initializeColorRbo(Functions *gl,GLuint rbo,Texture2D *ref)

{
  glScissorFunc p_Var1;
  glClearColorFunc p_Var2;
  int iVar3;
  GLenum GVar4;
  deBool dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  PixelBufferAccess *pPVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  PixelBufferAccess local_70;
  Vector<int,_2> local_48;
  IVec2 size;
  int ndx;
  Texture2D *ref_local;
  GLuint rbo_local;
  Functions *gl_local;
  
  if ((initializeColorRbo(glw::Functions_const&,unsigned_int,tcu::Texture2D&)::colorValues == '\0')
     && (iVar3 = __cxa_guard_acquire(&initializeColorRbo(glw::Functions_const&,unsigned_int,tcu::Texture2D&)
                                      ::colorValues), iVar3 != 0)) {
    tcu::Vector<float,_4>::Vector(initializeColorRbo::colorValues,0.9,0.5,0.65,1.0);
    tcu::Vector<float,_4>::Vector(initializeColorRbo::colorValues + 1,0.5,0.7,0.65,1.0);
    tcu::Vector<float,_4>::Vector(initializeColorRbo::colorValues + 2,0.2,0.5,0.65,1.0);
    tcu::Vector<float,_4>::Vector(initializeColorRbo::colorValues + 3,0.3,0.1,0.5,1.0);
    tcu::Vector<float,_4>::Vector(initializeColorRbo::colorValues + 4,0.8,0.2,0.3,1.0);
    tcu::Vector<float,_4>::Vector(initializeColorRbo::colorValues + 5,0.9,0.4,0.8,1.0);
    __cxa_guard_release(&initializeColorRbo(glw::Functions_const&,unsigned_int,tcu::Texture2D&)::
                         colorValues);
  }
  do {
    (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,rbo);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,
                    "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1b9);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*gl->clearColor)(1.0,1.0,0.0,1.0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"clearColor(1.0f, 1.0f, 0.0f, 1.0f)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1ba);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*gl->clear)(0x4000);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"clear(GL_COLOR_BUFFER_BIT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1bb);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  pPVar9 = tcu::TextureLevelPyramid::getLevel(&ref->super_TextureLevelPyramid,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(size.m_data + 1),1.0,1.0,0.0,1.0);
  tcu::clear(pPVar9,(Vec4 *)(size.m_data + 1));
  do {
    (*gl->enable)(0xc11);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"enable(GL_SCISSOR_TEST)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1bf);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  for (size.m_data[0] = 0; size.m_data[0] < 6; size.m_data[0] = size.m_data[0] + 1) {
    iVar3 = 6 - size.m_data[0];
    iVar6 = tcu::Texture2D::getWidth(ref);
    iVar7 = 6 - size.m_data[0];
    iVar8 = tcu::Texture2D::getHeight(ref);
    tcu::Vector<int,_2>::Vector
              (&local_48,(int)((float)iVar3 * ((float)iVar6 / 6.0)),
               (int)((float)iVar7 * ((float)iVar8 / 10.0)));
    iVar3 = tcu::Vector<int,_2>::x(&local_48);
    if ((iVar3 == 0) || (iVar3 = tcu::Vector<int,_2>::y(&local_48), iVar3 == 0)) break;
    do {
      p_Var1 = gl->scissor;
      iVar3 = tcu::Vector<int,_2>::x(&local_48);
      iVar6 = tcu::Vector<int,_2>::y(&local_48);
      (*p_Var1)(0,0,iVar3,iVar6);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"scissor(0, 0, size.x(), size.y())",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x1c8);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    do {
      p_Var2 = gl->clearColor;
      fVar10 = tcu::Vector<float,_4>::x(initializeColorRbo::colorValues + size.m_data[0]);
      fVar11 = tcu::Vector<float,_4>::y(initializeColorRbo::colorValues + size.m_data[0]);
      fVar12 = tcu::Vector<float,_4>::z(initializeColorRbo::colorValues + size.m_data[0]);
      fVar13 = tcu::Vector<float,_4>::w(initializeColorRbo::colorValues + size.m_data[0]);
      (*p_Var2)(fVar10,fVar11,fVar12,fVar13);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,
                      "clearColor(colorValues[ndx].x(), colorValues[ndx].y(), colorValues[ndx].z(), colorValues[ndx].w())"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x1c9);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    do {
      (*gl->clear)(0x4000);
      GVar4 = (*gl->getError)();
      glu::checkError(GVar4,"clear(GL_COLOR_BUFFER_BIT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                      ,0x1ca);
      dVar5 = ::deGetFalse();
    } while (dVar5 != 0);
    pPVar9 = tcu::TextureLevelPyramid::getLevel(&ref->super_TextureLevelPyramid,0);
    iVar3 = tcu::Vector<int,_2>::x(&local_48);
    iVar6 = tcu::Vector<int,_2>::y(&local_48);
    tcu::getSubregion(&local_70,pPVar9,0,0,iVar3,iVar6);
    tcu::clear(&local_70,initializeColorRbo::colorValues + size.m_data[0]);
  }
  do {
    (*gl->disable)(0xc11);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,"disable(GL_SCISSOR_TEST)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1cf);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  do {
    (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,0);
    GVar4 = (*gl->getError)();
    glu::checkError(GVar4,
                    "framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageUtil.cpp"
                    ,0x1d1);
    dVar5 = ::deGetFalse();
  } while (dVar5 != 0);
  return;
}

Assistant:

void initializeColorRbo(const glw::Functions& gl, GLuint rbo, Texture2D& ref)
{
	static const tcu::Vec4 colorValues[] =
	{
		tcu::Vec4(0.9f, 0.5f, 0.65f, 1.0f),
		tcu::Vec4(0.5f, 0.7f, 0.65f, 1.0f),
		tcu::Vec4(0.2f, 0.5f, 0.65f, 1.0f),
		tcu::Vec4(0.3f, 0.1f, 0.5f, 1.0f),
		tcu::Vec4(0.8f, 0.2f, 0.3f, 1.0f),
		tcu::Vec4(0.9f, 0.4f, 0.8f, 1.0f),
	};

	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
												   GL_RENDERBUFFER, rbo));
	GLU_CHECK_GLW_CALL(gl, clearColor(1.0f, 1.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(gl, clear(GL_COLOR_BUFFER_BIT));
	tcu::clear(ref.getLevel(0), Vec4(1.0f, 1.0f, 0.0f, 1.0f));

	// create a pattern
	GLU_CHECK_GLW_CALL(gl, enable(GL_SCISSOR_TEST));
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(colorValues); ++ndx)
	{
		const tcu::IVec2	size	= tcu::IVec2((int)((float)(DE_LENGTH_OF_ARRAY(colorValues) - ndx) * ((float)ref.getWidth() / float(DE_LENGTH_OF_ARRAY(colorValues)))),
												 (int)((float)(DE_LENGTH_OF_ARRAY(colorValues) - ndx) * ((float)ref.getHeight() / float(DE_LENGTH_OF_ARRAY(colorValues) + 4)))); // not symmetric

		if (size.x() == 0 || size.y() == 0)
			break;

		GLU_CHECK_GLW_CALL(gl, scissor(0, 0, size.x(), size.y()));
		GLU_CHECK_GLW_CALL(gl, clearColor(colorValues[ndx].x(), colorValues[ndx].y(), colorValues[ndx].z(), colorValues[ndx].w()));
		GLU_CHECK_GLW_CALL(gl, clear(GL_COLOR_BUFFER_BIT));

		tcu::clear(tcu::getSubregion(ref.getLevel(0), 0, 0, size.x(), size.y()), colorValues[ndx]);
	}

	GLU_CHECK_GLW_CALL(gl, disable(GL_SCISSOR_TEST));
	GLU_CHECK_GLW_CALL(gl, framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0,
												   GL_RENDERBUFFER, 0));
}